

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorld.cpp
# Opt level: O1

void __thiscall
btCollisionWorld::addCollisionObject
          (btCollisionWorld *this,btCollisionObject *collisionObject,short collisionFilterGroup,
          short collisionFilterMask)

{
  int iVar1;
  btCollisionObject **ptr;
  int iVar2;
  btCollisionObject **ppbVar3;
  long lVar4;
  undefined4 extraout_var;
  long lVar5;
  int iVar6;
  btVector3 maxAabb;
  btVector3 minAabb;
  btTransform trans;
  
  iVar2 = (this->m_collisionObjects).m_size;
  iVar1 = (this->m_collisionObjects).m_capacity;
  if (iVar2 == iVar1) {
    iVar6 = 1;
    if (iVar2 != 0) {
      iVar6 = iVar2 * 2;
    }
    if (iVar1 < iVar6) {
      if (iVar6 == 0) {
        ppbVar3 = (btCollisionObject **)0x0;
      }
      else {
        ppbVar3 = (btCollisionObject **)btAlignedAllocInternal((long)iVar6 << 3,0x10);
      }
      lVar4 = (long)(this->m_collisionObjects).m_size;
      if (0 < lVar4) {
        lVar5 = 0;
        do {
          ppbVar3[lVar5] = (this->m_collisionObjects).m_data[lVar5];
          lVar5 = lVar5 + 1;
        } while (lVar4 != lVar5);
      }
      ptr = (this->m_collisionObjects).m_data;
      if (ptr != (btCollisionObject **)0x0) {
        if ((this->m_collisionObjects).m_ownsMemory == true) {
          btAlignedFreeInternal(ptr);
        }
        (this->m_collisionObjects).m_data = (btCollisionObject **)0x0;
      }
      (this->m_collisionObjects).m_ownsMemory = true;
      (this->m_collisionObjects).m_data = ppbVar3;
      (this->m_collisionObjects).m_capacity = iVar6;
    }
  }
  iVar2 = (this->m_collisionObjects).m_size;
  (this->m_collisionObjects).m_data[iVar2] = collisionObject;
  (this->m_collisionObjects).m_size = iVar2 + 1;
  trans.m_basis.m_el[0].m_floats._0_8_ =
       *(undefined8 *)(collisionObject->m_worldTransform).m_basis.m_el[0].m_floats;
  trans.m_basis.m_el[0].m_floats._8_8_ =
       *(undefined8 *)((collisionObject->m_worldTransform).m_basis.m_el[0].m_floats + 2);
  trans.m_basis.m_el[1].m_floats._0_8_ =
       *(undefined8 *)(collisionObject->m_worldTransform).m_basis.m_el[1].m_floats;
  trans.m_basis.m_el[1].m_floats._8_8_ =
       *(undefined8 *)((collisionObject->m_worldTransform).m_basis.m_el[1].m_floats + 2);
  trans.m_basis.m_el[2].m_floats._0_8_ =
       *(undefined8 *)(collisionObject->m_worldTransform).m_basis.m_el[2].m_floats;
  trans.m_basis.m_el[2].m_floats._8_8_ =
       *(undefined8 *)((collisionObject->m_worldTransform).m_basis.m_el[2].m_floats + 2);
  trans.m_origin.m_floats[0] = (collisionObject->m_worldTransform).m_origin.m_floats[0];
  trans.m_origin.m_floats[1] = (collisionObject->m_worldTransform).m_origin.m_floats[1];
  trans.m_origin.m_floats[2] = (collisionObject->m_worldTransform).m_origin.m_floats[2];
  trans.m_origin.m_floats[3] = (collisionObject->m_worldTransform).m_origin.m_floats[3];
  (*collisionObject->m_collisionShape->_vptr_btCollisionShape[2])
            (collisionObject->m_collisionShape,&trans,&minAabb,&maxAabb);
  iVar2 = (*this->m_broadphasePairCache->_vptr_btBroadphaseInterface[2])
                    (this->m_broadphasePairCache,&minAabb,&maxAabb,
                     (ulong)(uint)collisionObject->m_collisionShape->m_shapeType,collisionObject,
                     (ulong)(uint)(int)collisionFilterGroup,(ulong)(uint)(int)collisionFilterMask,
                     this->m_dispatcher1,0);
  collisionObject->m_broadphaseHandle = (btBroadphaseProxy *)CONCAT44(extraout_var,iVar2);
  return;
}

Assistant:

void	btCollisionWorld::addCollisionObject(btCollisionObject* collisionObject,short int collisionFilterGroup,short int collisionFilterMask)
{

	btAssert(collisionObject);

	//check that the object isn't already added
	btAssert( m_collisionObjects.findLinearSearch(collisionObject)  == m_collisionObjects.size());

	m_collisionObjects.push_back(collisionObject);

	//calculate new AABB
	btTransform trans = collisionObject->getWorldTransform();

	btVector3	minAabb;
	btVector3	maxAabb;
	collisionObject->getCollisionShape()->getAabb(trans,minAabb,maxAabb);

	int type = collisionObject->getCollisionShape()->getShapeType();
	collisionObject->setBroadphaseHandle( getBroadphase()->createProxy(
		minAabb,
		maxAabb,
		type,
		collisionObject,
		collisionFilterGroup,
		collisionFilterMask,
		m_dispatcher1,0
		))	;





}